

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

QTableWidgetItem * __thiscall QTableModel::takeItem(QTableModel *this,int row,int column)

{
  pointer ppQVar1;
  QTableWidgetItem *pQVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<int> local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (long)column + (long)row * (this->horizontalHeaderItems).d.size;
  if ((uVar3 < (ulong)(this->tableItems).d.size) &&
     (pQVar2 = (this->tableItems).d.ptr[uVar3], pQVar2 != (QTableWidgetItem *)0x0)) {
    pQVar2->view = (QTableWidget *)0x0;
    pQVar2->d->id = -1;
    ppQVar1 = QList<QTableWidgetItem_*>::data(&this->tableItems);
    ppQVar1[uVar3] = (QTableWidgetItem *)0x0;
    local_48.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)0xffffffffffffffff;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (int *)0x0;
    local_78.size = 0;
    (**(code **)(*(long *)this + 0x60))((QModelIndex *)&local_58,this,row,column,&local_78);
    local_78.d = (Data *)0x0;
    local_78.ptr = (int *)0x0;
    local_78.size = 0;
    QAbstractItemModel::dataChanged
              ((QModelIndex *)this,(QModelIndex *)&local_58,(QList_conflict *)&local_58);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_78);
  }
  else {
    pQVar2 = (QTableWidgetItem *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QTableWidgetItem *QTableModel::takeItem(int row, int column)
{
    long i = tableIndex(row, column);
    QTableWidgetItem *itm = tableItems.value(i);
    if (itm) {
        itm->view = nullptr;
        itm->d->id = -1;
        tableItems[i] = 0;
        const QModelIndex ind = index(row, column);
        emit dataChanged(ind, ind);
    }
    return itm;
}